

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ancientzip.cpp
# Opt level: O2

int __thiscall
FZipExploder::DecodeSF
          (FZipExploder *this,TArray<FZipExploder::HuffNode,_FZipExploder::HuffNode> *decoder,
          int numvals)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  TableBuilder builder [256];
  
  iVar7 = 0;
  if (this->InLeft == 0) {
    bVar1 = 0;
  }
  else {
    this->InLeft = this->InLeft - 1;
    uVar3 = this->bs;
    if (uVar3 < this->be) {
      this->bs = uVar3 + 1;
      bVar1 = this->ReadBuf[uVar3];
    }
    else {
      uVar3 = (*(this->In->super_FileReaderBase)._vptr_FileReaderBase[2])
                        (this->In,this->ReadBuf,0x100);
      this->be = uVar3;
      bVar1 = this->ReadBuf[0];
      this->bs = 1;
    }
  }
  iVar4 = 0;
  for (; iVar7 != bVar1 + 1; iVar7 = iVar7 + 1) {
    if (this->InLeft == 0) {
      bVar2 = 0;
    }
    else {
      this->InLeft = this->InLeft - 1;
      uVar3 = this->bs;
      if (uVar3 < this->be) {
        this->bs = uVar3 + 1;
        bVar2 = this->ReadBuf[uVar3];
      }
      else {
        uVar3 = (*(this->In->super_FileReaderBase)._vptr_FileReaderBase[2])
                          (this->In,this->ReadBuf,0x100);
        this->be = uVar3;
        bVar2 = this->ReadBuf[0];
        this->bs = 1;
      }
    }
    iVar5 = iVar4;
    for (lVar6 = 0; (bVar2 >> 4) + 1 != (int)lVar6; lVar6 = lVar6 + 1) {
      builder[iVar4 + lVar6].Length = (bVar2 & 0xf) + 1;
      builder[iVar4 + lVar6].Value = (uchar)iVar5;
      iVar5 = iVar5 + 1;
    }
    iVar4 = iVar5;
  }
  if (iVar4 == numvals) {
    BuildDecoder(this,decoder,builder,numvals);
  }
  return (uint)(iVar4 != numvals);
}

Assistant:

int FZipExploder::DecodeSF(TArray<HuffNode> &decoder, int numvals)
{
	TableBuilder builder[256];
	unsigned char a, c;
	int i, n, v = 0;

	READBYTE(c);
	n = c + 1;
	for (i = 0; i < n; i++) {
		int nv, bl;
		READBYTE(a);
		nv = ((a >> 4) & 15) + 1;
		bl = (a & 15) + 1;
		while (nv--) {
			builder[v].Length = bl;
			builder[v].Value = v;
			v++;
		}
	}
	if (v != numvals)
		return 1;	/* bad table */
	return BuildDecoder(decoder, builder, v);
}